

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging::formatInstruction
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Detail *detail,Operand_ *opArray,uint32_t opCount)

{
  uint uVar1;
  Error EVar2;
  Error EVar3;
  StringBuilder *sb_00;
  undefined4 in_ECX;
  StringBuilder *in_RDX;
  uint in_ESI;
  StringBuilder *in_RDI;
  uint *in_R8;
  long in_R9;
  uint in_stack_00000008;
  Error _err_21;
  Error _err_20;
  Error _err_19;
  Error _err_18;
  Error _err_17;
  Error _err_16;
  Error _err_15;
  uint32_t j;
  uint32_t vecSize;
  Error _err_14;
  Error _err_13;
  Operand_ *op;
  uint32_t i;
  Error _err_12;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  uint32_t kRXBWMask;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  X86Inst *instInfo;
  uint32_t options;
  uint32_t instId;
  char in_stack_fffffffffffffad3;
  uint32_t in_stack_fffffffffffffad4;
  StringBuilder *in_stack_fffffffffffffad8;
  StringBuilder *this;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  uint *in_stack_fffffffffffffae8;
  StringBuilder *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  uint in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb38;
  uint in_stack_fffffffffffffb3c;
  uint local_4c0;
  uint uVar4;
  uint32_t uVar5;
  undefined4 in_stack_fffffffffffffb58;
  uint uVar6;
  undefined4 in_stack_fffffffffffffb5c;
  uint32_t in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  uint32_t in_stack_fffffffffffffb74;
  StringBuilder *in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  
  uVar6 = *in_R8;
  uVar1 = in_R8[1];
  if (uVar6 < 0x59c) {
    if (0x59b < uVar6) {
      DebugUtils::assertionFailed
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0);
    }
    if (((uVar1 & 0x40) != 0) &&
       (EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)),
       EVar2 != 0)) {
      return EVar2;
    }
    if (((uVar1 & 0x80) != 0) &&
       (EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)),
       EVar2 != 0)) {
      return EVar2;
    }
    if (((uVar1 & 0x10000) != 0) &&
       (EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)),
       EVar2 != 0)) {
      return EVar2;
    }
    if (((uVar1 & 0x20000) != 0) &&
       (EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)),
       EVar2 != 0)) {
      return EVar2;
    }
    if (((uVar1 & 0x2000) != 0) &&
       (EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)),
       EVar2 != 0)) {
      return EVar2;
    }
    if (((uVar1 & 0xc000) != 0) &&
       (StringBuilder::_opString
                  ((StringBuilder *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                   (char *)in_stack_fffffffffffffae8,
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)), in_R8[2] != 0)) {
      EVar2 = StringBuilder::_opChar
                        (in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,
                         in_stack_fffffffffffffad3);
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb78 = *(StringBuilder **)(in_R8 + 2);
      in_stack_fffffffffffffafc = in_ESI;
      EVar2 = formatOperand(in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                            (CodeEmitter *)
                            CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                            in_stack_fffffffffffffb64,
                            (Operand_ *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      if (EVar2 != 0) {
        return EVar2;
      }
      EVar2 = StringBuilder::_opString
                        ((StringBuilder *)
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (uint32_t)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffae8,
                         CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb74 = 0;
      in_stack_fffffffffffffaf0 = in_RDI;
    }
    if ((uVar1 & 0x80000000) != 0) {
      uVar5 = (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
      if ((uVar1 & 0x1e000000) == 0) {
        EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),uVar5,
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_fffffffffffffb6c = 0;
      }
      else {
        StringBuilder::_opString
                  ((StringBuilder *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   uVar5,(char *)in_stack_fffffffffffffae8,
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        if ((uVar1 & 0x8000000) != 0) {
          StringBuilder::_opChar
                    (in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffad3);
        }
        if ((uVar1 & 0x4000000) != 0) {
          StringBuilder::_opChar
                    (in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffad3);
        }
        if ((uVar1 & 0x2000000) != 0) {
          StringBuilder::_opChar
                    (in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffad3);
        }
        if ((uVar1 & 0x10000000) != 0) {
          StringBuilder::_opChar
                    (in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffad3);
        }
        StringBuilder::_opChar
                  (in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffad3);
      }
    }
    if ((uVar1 & 0x400) != 0) {
      EVar2 = StringBuilder::_opString
                        ((StringBuilder *)
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                         (char *)in_stack_fffffffffffffae8,
                         CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb68 = 0;
    }
    if ((uVar1 & 0x1000) != 0) {
      EVar2 = StringBuilder::_opString
                        ((StringBuilder *)
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                         (char *)in_stack_fffffffffffffae8,
                         CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb64 = 0;
    }
    EVar2 = StringBuilder::_opString
                      ((StringBuilder *)
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                       (char *)in_stack_fffffffffffffae8,
                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  else {
    EVar2 = StringBuilder::appendFormat(in_RDI,"<unknown id=#%u>",(ulong)uVar6);
    if (EVar2 != 0) {
      return EVar2;
    }
    in_stack_fffffffffffffb5c = 0;
  }
  uVar6 = 0;
  do {
    if ((in_stack_00000008 <= uVar6) ||
       (sb_00 = (StringBuilder *)(in_R9 + (ulong)uVar6 * 0x10), ((ulong)sb_00->_data & 7) == 0)) {
      return 0;
    }
    EVar2 = StringBuilder::_opString
                      ((StringBuilder *)
                       CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                       (char *)in_stack_fffffffffffffae8,
                       CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
    if (EVar2 != 0) {
      return EVar2;
    }
    EVar3 = formatOperand(in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                          (CodeEmitter *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                          in_stack_fffffffffffffb64,
                          (Operand_ *)CONCAT44(in_stack_fffffffffffffb5c,uVar6));
    if (EVar3 != 0) {
      return EVar3;
    }
    if ((((ulong)sb_00->_data & 7) == 3) && ((in_ESI & 2) != 0)) {
      uVar4 = 0x10;
      uVar5 = 0;
      for (local_4c0 = 0; local_4c0 < in_stack_00000008; local_4c0 = local_4c0 + 1) {
        if ((*(uint *)(in_R9 + (ulong)local_4c0 * 0x10) & 7) == 1) {
          in_stack_fffffffffffffb3c = *(uint *)(in_R9 + (ulong)local_4c0 * 0x10) >> 0x18;
          in_stack_fffffffffffffae8 =
               std::max<unsigned_int>
                         ((uint *)&stack0xfffffffffffffb44,(uint *)&stack0xfffffffffffffb3c);
          uVar4 = *in_stack_fffffffffffffae8;
        }
      }
      EVar2 = X86Logging_formatImmExtended
                        (sb_00,EVar2,uVar5,uVar4,
                         (Imm *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffffb38 = 0;
    }
    if (uVar6 == 0) {
      uVar5 = (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
      if ((in_R8[2] >> 8 & 0xf) == 3) {
        EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),uVar5,
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar4 = in_ESI;
        this = in_RDX;
        in_stack_fffffffffffffae4 = in_ECX;
        EVar2 = formatOperand(in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                              (CodeEmitter *)
                              CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                              in_stack_fffffffffffffb64,
                              (Operand_ *)CONCAT44(in_stack_fffffffffffffb5c,uVar6));
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = StringBuilder::_opChar(this,uVar4,in_stack_fffffffffffffad3);
        if (EVar2 != 0) {
          return EVar2;
        }
        if ((uVar1 & 0x800000) != 0) {
          EVar2 = StringBuilder::_opString
                            ((StringBuilder *)
                             CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                             (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                             (char *)in_stack_fffffffffffffae8,
                             CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
joined_r0x00235e06:
          if (EVar2 != 0) {
            return EVar2;
          }
        }
      }
      else if ((uVar1 & 0x800000) != 0) {
        EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),uVar5,
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        goto joined_r0x00235e06;
      }
    }
    if (((((ulong)sb_00->_data & 7) == 2) && ((uVar1 & 0x100000) != 0)) &&
       (EVar2 = StringBuilder::_opString
                          ((StringBuilder *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                           (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
                           (char *)in_stack_fffffffffffffae8,
                           CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)),
       EVar2 != 0)) {
      return EVar2;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Logging::formatInstruction(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Inst::Detail& detail, const Operand_* opArray, uint32_t opCount) noexcept {

  uint32_t instId = detail.instId;
  uint32_t options = detail.options;

  // Format instruction options and instruction mnemonic.
  if (instId < X86Inst::_kIdCount) {
    const X86Inst& instInfo = X86Inst::getInst(instId);

    // SHORT|LONG options.
    if (options & X86Inst::kOptionShortForm) ASMJIT_PROPAGATE(sb.appendString("short "));
    if (options & X86Inst::kOptionLongForm) ASMJIT_PROPAGATE(sb.appendString("long "));

    // LOCK|XACQUIRE|XRELEASE options.
    if (options & X86Inst::kOptionXAcquire) ASMJIT_PROPAGATE(sb.appendString("xacquire "));
    if (options & X86Inst::kOptionXRelease) ASMJIT_PROPAGATE(sb.appendString("xrelease "));
    if (options & X86Inst::kOptionLock) ASMJIT_PROPAGATE(sb.appendString("lock "));

    // REP|REPNZ options.
    if (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) {
      sb.appendString((options & X86Inst::kOptionRep) ? "rep " : "repnz ");
      if (detail.hasExtraReg()) {
        ASMJIT_PROPAGATE(sb.appendChar('{'));
        ASMJIT_PROPAGATE(formatOperand(sb, logOptions, emitter, archType, detail.extraReg.toReg<Reg>()));
        ASMJIT_PROPAGATE(sb.appendString("} "));
      }
    }

    // REX options.
    if (options & X86Inst::kOptionRex) {
      const uint32_t kRXBWMask = X86Inst::kOptionOpCodeR |
                                 X86Inst::kOptionOpCodeX |
                                 X86Inst::kOptionOpCodeB |
                                 X86Inst::kOptionOpCodeW ;
      if (options & kRXBWMask) {
        sb.appendString("rex.");
        if (options & X86Inst::kOptionOpCodeR) sb.appendChar('r');
        if (options & X86Inst::kOptionOpCodeX) sb.appendChar('x');
        if (options & X86Inst::kOptionOpCodeB) sb.appendChar('b');
        if (options & X86Inst::kOptionOpCodeW) sb.appendChar('w');
        sb.appendChar(' ');
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString("rex "));
      }
    }

    // VEX|EVEX options.
    if (options & X86Inst::kOptionVex3) ASMJIT_PROPAGATE(sb.appendString("vex3 "));
    if (options & X86Inst::kOptionEvex) ASMJIT_PROPAGATE(sb.appendString("evex "));

    ASMJIT_PROPAGATE(sb.appendString(instInfo.getName()));
  }
  else {
    ASMJIT_PROPAGATE(sb.appendFormat("<unknown id=#%u>", static_cast<unsigned int>(instId)));
  }

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand_& op = opArray[i];
    if (op.isNone()) break;

    ASMJIT_PROPAGATE(sb.appendString(i == 0 ? " " : ", "));
    ASMJIT_PROPAGATE(formatOperand(sb, logOptions, emitter, archType, op));

    if (op.isImm() && (logOptions & Logger::kOptionImmExtended)) {
      uint32_t vecSize = 16;
      for (uint32_t j = 0; j < opCount; j++)
        if (opArray[j].isReg())
          vecSize = std::max<uint32_t>(vecSize, opArray[j].getSize());
      ASMJIT_PROPAGATE(X86Logging_formatImmExtended(sb, logOptions, instId, vecSize, op.as<Imm>()));
    }

    // Support AVX-512 {k}{z}.
    if (i == 0) {
      if (detail.extraReg.getKind() == X86Reg::kKindK) {
        ASMJIT_PROPAGATE(sb.appendString(" {"));
        ASMJIT_PROPAGATE(formatOperand(sb, logOptions, emitter, archType, detail.extraReg.toReg<Reg>()));
        ASMJIT_PROPAGATE(sb.appendChar('}'));

        if (options & X86Inst::kOptionZMask)
          ASMJIT_PROPAGATE(sb.appendString("{z}"));
      }
      else if (options & X86Inst::kOptionZMask) {
        ASMJIT_PROPAGATE(sb.appendString(" {z}"));
      }
    }

    // Support AVX-512 {1tox}.
    if (op.isMem() && (options & X86Inst::kOption1ToX))
      ASMJIT_PROPAGATE(sb.appendString(" {1tox}"));
  }

  return kErrorOk;
}